

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res zlib_onebyte_dynamic(void)

{
  int iVar1;
  uint local_14;
  int res;
  uint dlen;
  uchar out [1];
  
  res._3_1_ = -1;
  local_14 = 1;
  iVar1 = tinf_zlib_uncompress((void *)((long)&res + 3),&local_14,zlib_onebyte_dynamic::data,0x12);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((iVar1 == 0) && (local_14 == 1)) && (res._3_1_ == '\0')) {
    greatest_info.msg = (char *)0x0;
    dlen = 0;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0x24d;
    greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    dlen = 0xffffffff;
  }
  return dlen;
}

Assistant:

TEST zlib_onebyte_dynamic(void)
{
	/* One byte 00, dynamic Huffman */
	static const unsigned char data[] = {
		0x78, 0x9C, 0x05, 0xC1, 0x81, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x10, 0xFF, 0xD5, 0x10, 0x00, 0x01, 0x00, 0x01
	};
	unsigned char out[] = { 0xFF };
	unsigned int dlen = 1;
	int res;

	res = tinf_zlib_uncompress(out, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == 1 && out[0] == 0);

	PASS();
}